

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

int test_sendfile(_func_void_int *setup,uv_fs_cb cb,off_t expected_size)

{
  int iVar1;
  uv_loop_t *loop;
  undefined8 uVar2;
  char *pcVar3;
  stat s2;
  stat s1;
  
  ::loop = (uv_loop_t *)uv_default_loop();
  unlink("test_file");
  unlink("test_file2");
  iVar1 = open64("test_file",0x41,0x180);
  if (iVar1 == -1) {
    pcVar3 = "f != -1";
    uVar2 = 0x480;
  }
  else {
    if (setup != (_func_void_int *)0x0) {
      (*setup)(iVar1);
    }
    iVar1 = close(iVar1);
    if (iVar1 == 0) {
      iVar1 = uv_fs_open(0,&open_req1,"test_file",2,0,0);
      if (iVar1 < 0) {
        pcVar3 = "r >= 0";
        uVar2 = 0x48a;
      }
      else if (open_req1.result._4_4_ < 0) {
        pcVar3 = "open_req1.result >= 0";
        uVar2 = 0x48b;
      }
      else {
        uv_fs_req_cleanup(&open_req1);
        iVar1 = uv_fs_open(0,&open_req2,"test_file2",0x41,0x180,0);
        if (iVar1 < 0) {
          pcVar3 = "r >= 0";
          uVar2 = 0x490;
        }
        else if (open_req2.result._4_4_ < 0) {
          pcVar3 = "open_req2.result >= 0";
          uVar2 = 0x491;
        }
        else {
          uv_fs_req_cleanup(&open_req2);
          iVar1 = uv_fs_sendfile(::loop,&sendfile_req,(undefined4)open_req2.result,
                                 (undefined4)open_req1.result,0,0x20000,cb);
          if (iVar1 == 0) {
            uv_run(::loop,0);
            if (sendfile_cb_count == 1) {
              iVar1 = uv_fs_close(0,&close_req,(undefined4)open_req1.result,0);
              if (iVar1 == 0) {
                uv_fs_req_cleanup(&close_req);
                iVar1 = uv_fs_close(0,&close_req,(undefined4)open_req2.result,0);
                if (iVar1 == 0) {
                  uv_fs_req_cleanup(&close_req);
                  iVar1 = stat64("test_file",(stat64 *)&s1);
                  if (iVar1 == 0) {
                    iVar1 = stat64("test_file2",(stat64 *)&s2);
                    if (iVar1 == 0) {
                      if (s1.st_size == s2.st_size) {
                        if (s1.st_size == expected_size) {
                          unlink("test_file");
                          unlink("test_file2");
                          loop = (uv_loop_t *)uv_default_loop();
                          close_loop(loop);
                          uVar2 = uv_default_loop();
                          iVar1 = uv_loop_close(uVar2);
                          if (iVar1 == 0) {
                            return 0;
                          }
                          pcVar3 = "0 == uv_loop_close(uv_default_loop())";
                          uVar2 = 0x4ab;
                        }
                        else {
                          pcVar3 = "s2.st_size == expected_size";
                          uVar2 = 0x4a5;
                        }
                      }
                      else {
                        pcVar3 = "s1.st_size == s2.st_size";
                        uVar2 = 0x4a4;
                      }
                    }
                    else {
                      pcVar3 = "0 == stat(\"test_file2\", &s2)";
                      uVar2 = 0x4a3;
                    }
                  }
                  else {
                    pcVar3 = "0 == stat(\"test_file\", &s1)";
                    uVar2 = 0x4a2;
                  }
                }
                else {
                  pcVar3 = "r == 0";
                  uVar2 = 0x49f;
                }
              }
              else {
                pcVar3 = "r == 0";
                uVar2 = 0x49c;
              }
            }
            else {
              pcVar3 = "sendfile_cb_count == 1";
              uVar2 = 0x499;
            }
          }
          else {
            pcVar3 = "r == 0";
            uVar2 = 0x496;
          }
        }
      }
    }
    else {
      pcVar3 = "r == 0";
      uVar2 = 0x486;
    }
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

static int test_sendfile(void (*setup)(int), uv_fs_cb cb, off_t expected_size) {
  int f, r;
  struct stat s1, s2;

  loop = uv_default_loop();

  /* Setup. */
  unlink("test_file");
  unlink("test_file2");

  f = open("test_file", O_WRONLY | O_CREAT, S_IWUSR | S_IRUSR);
  ASSERT(f != -1);

  if (setup != NULL)
    setup(f);

  r = close(f);
  ASSERT(r == 0);

  /* Test starts here. */
  r = uv_fs_open(NULL, &open_req1, "test_file", O_RDWR, 0, NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  r = uv_fs_open(NULL, &open_req2, "test_file2", O_WRONLY | O_CREAT,
      S_IWUSR | S_IRUSR, NULL);
  ASSERT(r >= 0);
  ASSERT(open_req2.result >= 0);
  uv_fs_req_cleanup(&open_req2);

  r = uv_fs_sendfile(loop, &sendfile_req, open_req2.result, open_req1.result,
      0, 131072, cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(sendfile_cb_count == 1);

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&close_req);
  r = uv_fs_close(NULL, &close_req, open_req2.result, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&close_req);

  ASSERT(0 == stat("test_file", &s1));
  ASSERT(0 == stat("test_file2", &s2));
  ASSERT(s1.st_size == s2.st_size);
  ASSERT(s2.st_size == expected_size);

  /* Cleanup. */
  unlink("test_file");
  unlink("test_file2");

  MAKE_VALGRIND_HAPPY();
  return 0;
}